

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_smooth_v_predictor_16x64_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  ushort uVar14;
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  unkuint9 Var18;
  undefined1 auVar19 [11];
  undefined1 auVar20 [15];
  unkuint9 Var21;
  undefined1 auVar22 [11];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  ulong uVar27;
  uint uVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  ushort uVar31;
  short sVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ushort uVar35;
  ushort uVar36;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  undefined1 auVar37 [16];
  short sVar52;
  short sVar55;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  short sVar56;
  ushort uVar57;
  ushort uVar58;
  short sVar60;
  ushort uVar61;
  ushort uVar62;
  short sVar63;
  ushort uVar64;
  ushort uVar65;
  short sVar66;
  ushort uVar67;
  ushort uVar68;
  short sVar69;
  ushort uVar70;
  ushort uVar71;
  short sVar72;
  ushort uVar73;
  ushort uVar74;
  short sVar75;
  ushort uVar76;
  ushort uVar77;
  undefined1 auVar59 [16];
  short sVar78;
  ushort uVar79;
  ushort uVar80;
  
  auVar30 = pshuflw(ZEXT116(left_column[0x3f]),ZEXT116(left_column[0x3f]),0);
  auVar1 = *(undefined1 (*) [16])top_row;
  auVar2[0xd] = 0;
  auVar2._0_13_ = auVar1._0_13_;
  auVar2[0xe] = auVar1[7];
  auVar4[0xc] = auVar1[6];
  auVar4._0_12_ = auVar1._0_12_;
  auVar4._13_2_ = auVar2._13_2_;
  auVar6[0xb] = 0;
  auVar6._0_11_ = auVar1._0_11_;
  auVar6._12_3_ = auVar4._12_3_;
  auVar8[10] = auVar1[5];
  auVar8._0_10_ = auVar1._0_10_;
  auVar8._11_4_ = auVar6._11_4_;
  auVar10[9] = 0;
  auVar10._0_9_ = auVar1._0_9_;
  auVar10._10_5_ = auVar8._10_5_;
  auVar12[8] = auVar1[4];
  auVar12._0_8_ = auVar1._0_8_;
  auVar12._9_6_ = auVar10._9_6_;
  auVar17._7_8_ = 0;
  auVar17._0_7_ = auVar12._8_7_;
  Var18 = CONCAT81(SUB158(auVar17 << 0x40,7),auVar1[3]);
  auVar23._9_6_ = 0;
  auVar23._0_9_ = Var18;
  auVar19._1_10_ = SUB1510(auVar23 << 0x30,5);
  auVar19[0] = auVar1[2];
  auVar24._11_4_ = 0;
  auVar24._0_11_ = auVar19;
  auVar15[2] = auVar1[1];
  auVar15._0_2_ = auVar1._0_2_;
  auVar15._3_12_ = SUB1512(auVar24 << 0x20,3);
  uVar31 = auVar1._0_2_ & 0xff;
  uVar27 = 0;
  do {
    auVar54 = *(undefined1 (*) [16])(smooth_weights + uVar27 + 0x3c);
    auVar3[0xd] = 0;
    auVar3._0_13_ = auVar54._0_13_;
    auVar3[0xe] = auVar54[7];
    auVar5[0xc] = auVar54[6];
    auVar5._0_12_ = auVar54._0_12_;
    auVar5._13_2_ = auVar3._13_2_;
    auVar7[0xb] = 0;
    auVar7._0_11_ = auVar54._0_11_;
    auVar7._12_3_ = auVar5._12_3_;
    auVar9[10] = auVar54[5];
    auVar9._0_10_ = auVar54._0_10_;
    auVar9._11_4_ = auVar7._11_4_;
    auVar11[9] = 0;
    auVar11._0_9_ = auVar54._0_9_;
    auVar11._10_5_ = auVar9._10_5_;
    auVar13[8] = auVar54[4];
    auVar13._0_8_ = auVar54._0_8_;
    auVar13._9_6_ = auVar11._9_6_;
    auVar20._7_8_ = 0;
    auVar20._0_7_ = auVar13._8_7_;
    Var21 = CONCAT81(SUB158(auVar20 << 0x40,7),auVar54[3]);
    auVar25._9_6_ = 0;
    auVar25._0_9_ = Var21;
    auVar22._1_10_ = SUB1510(auVar25 << 0x30,5);
    auVar22[0] = auVar54[2];
    auVar26._11_4_ = 0;
    auVar26._0_11_ = auVar22;
    auVar16[2] = auVar54[1];
    auVar16._0_2_ = auVar54._0_2_;
    auVar16._3_12_ = SUB1512(auVar26 << 0x20,3);
    auVar37._0_2_ = auVar54._0_2_ & 0xff;
    auVar37._2_13_ = auVar16._2_13_;
    auVar37[0xf] = 0;
    auVar33._0_2_ = CONCAT11(0,auVar54[8]);
    auVar33[2] = auVar54[9];
    auVar33[3] = 0;
    auVar33[4] = auVar54[10];
    auVar33[5] = 0;
    auVar33[6] = auVar54[0xb];
    auVar33[7] = 0;
    auVar33[8] = auVar54[0xc];
    auVar33[9] = 0;
    auVar33[10] = auVar54[0xd];
    auVar33[0xb] = 0;
    auVar33[0xc] = auVar54[0xe];
    auVar33[0xd] = 0;
    auVar33[0xe] = auVar54[0xf];
    auVar33[0xf] = 0;
    sVar52 = auVar30._0_2_;
    auVar34._0_2_ = (0x100 - auVar37._0_2_) * sVar52;
    sVar55 = auVar30._2_2_;
    auVar34._2_2_ = (0x100 - auVar16._2_2_) * sVar55;
    auVar34._4_2_ = (0x100 - auVar22._0_2_) * sVar52;
    auVar34._6_2_ = (0x100 - (short)Var21) * sVar55;
    auVar34._8_2_ = (0x100 - auVar13._8_2_) * sVar52;
    auVar34._10_2_ = (0x100 - auVar9._10_2_) * sVar55;
    auVar34._12_2_ = (0x100 - auVar5._12_2_) * sVar52;
    auVar34._14_2_ = (0x100 - (auVar3._13_2_ >> 8)) * sVar55;
    uVar28 = 0xfefdfefe;
    do {
      uVar28 = uVar28 + 0x2020202;
      auVar59._4_4_ = uVar28;
      auVar59._0_4_ = uVar28;
      auVar59._8_4_ = uVar28;
      auVar59._12_4_ = uVar28;
      auVar53 = pshufb(auVar37,auVar59);
      auVar59 = pshufb(auVar34,auVar59);
      sVar32 = (short)Var18;
      uVar14 = auVar2._13_2_ >> 8;
      sVar56 = auVar59._0_2_ + 0x80;
      sVar60 = auVar59._2_2_ + 0x80;
      sVar63 = auVar59._4_2_ + 0x80;
      sVar66 = auVar59._6_2_ + 0x80;
      sVar69 = auVar59._8_2_ + 0x80;
      sVar72 = auVar59._10_2_ + 0x80;
      sVar75 = auVar59._12_2_ + 0x80;
      sVar78 = auVar59._14_2_ + 0x80;
      uVar35 = auVar53._0_2_ * uVar31 + sVar56;
      uVar38 = auVar53._2_2_ * auVar15._2_2_ + sVar60;
      uVar40 = auVar53._4_2_ * auVar19._0_2_ + sVar63;
      uVar42 = auVar53._6_2_ * sVar32 + sVar66;
      uVar44 = auVar53._8_2_ * auVar12._8_2_ + sVar69;
      uVar46 = auVar53._10_2_ * auVar8._10_2_ + sVar72;
      uVar48 = auVar53._12_2_ * auVar4._12_2_ + sVar75;
      uVar50 = auVar53._14_2_ * uVar14 + sVar78;
      uVar36 = uVar35 >> 8;
      uVar39 = uVar38 >> 8;
      uVar41 = uVar40 >> 8;
      uVar43 = uVar42 >> 8;
      uVar45 = uVar44 >> 8;
      uVar47 = uVar46 >> 8;
      uVar49 = uVar48 >> 8;
      uVar51 = uVar50 >> 8;
      uVar57 = sVar56 + auVar53._0_2_ * (ushort)auVar1[8];
      uVar61 = sVar60 + auVar53._2_2_ * (ushort)auVar1[9];
      uVar64 = sVar63 + auVar53._4_2_ * (ushort)auVar1[10];
      uVar67 = sVar66 + auVar53._6_2_ * (ushort)auVar1[0xb];
      uVar70 = sVar69 + auVar53._8_2_ * (ushort)auVar1[0xc];
      uVar73 = sVar72 + auVar53._10_2_ * (ushort)auVar1[0xd];
      uVar76 = sVar75 + auVar53._12_2_ * (ushort)auVar1[0xe];
      uVar79 = sVar78 + auVar53._14_2_ * (ushort)auVar1[0xf];
      uVar58 = uVar57 >> 8;
      uVar62 = uVar61 >> 8;
      uVar65 = uVar64 >> 8;
      uVar68 = uVar67 >> 8;
      uVar71 = uVar70 >> 8;
      uVar74 = uVar73 >> 8;
      uVar77 = uVar76 >> 8;
      uVar80 = uVar79 >> 8;
      *dst = (uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) - (0xff < uVar36);
      dst[1] = (uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39);
      dst[2] = (uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41);
      dst[3] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43);
      dst[4] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
      dst[5] = (uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47);
      dst[6] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
      dst[7] = (uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8) - (0xff < uVar51);
      dst[8] = (uVar58 != 0) * (uVar58 < 0x100) * (char)(uVar57 >> 8) - (0xff < uVar58);
      dst[9] = (uVar62 != 0) * (uVar62 < 0x100) * (char)(uVar61 >> 8) - (0xff < uVar62);
      dst[10] = (uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65);
      dst[0xb] = (uVar68 != 0) * (uVar68 < 0x100) * (char)(uVar67 >> 8) - (0xff < uVar68);
      dst[0xc] = (uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar71);
      dst[0xd] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
      dst[0xe] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
      dst[0xf] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
      dst = dst + stride;
    } while (uVar28 < 0xd0c0d0d);
    auVar53._0_2_ = (0x100 - auVar33._0_2_) * sVar52;
    auVar53._2_2_ = (0x100 - (ushort)auVar54[9]) * sVar55;
    auVar53._4_2_ = (0x100 - (ushort)auVar54[10]) * sVar52;
    auVar53._6_2_ = (0x100 - (ushort)auVar54[0xb]) * sVar55;
    auVar53._8_2_ = (0x100 - (ushort)auVar54[0xc]) * sVar52;
    auVar53._10_2_ = (0x100 - (ushort)auVar54[0xd]) * sVar55;
    auVar53._12_2_ = (0x100 - (ushort)auVar54[0xe]) * sVar52;
    auVar53._14_2_ = (0x100 - (ushort)auVar54[0xf]) * sVar55;
    uVar28 = 0xfefdfefe;
    do {
      uVar28 = uVar28 + 0x2020202;
      auVar54._4_4_ = uVar28;
      auVar54._0_4_ = uVar28;
      auVar54._8_4_ = uVar28;
      auVar54._12_4_ = uVar28;
      auVar37 = pshufb(auVar33,auVar54);
      auVar54 = pshufb(auVar53,auVar54);
      sVar52 = auVar54._0_2_ + 0x80;
      sVar55 = auVar54._2_2_ + 0x80;
      sVar56 = auVar54._4_2_ + 0x80;
      sVar60 = auVar54._6_2_ + 0x80;
      sVar63 = auVar54._8_2_ + 0x80;
      sVar66 = auVar54._10_2_ + 0x80;
      sVar69 = auVar54._12_2_ + 0x80;
      sVar72 = auVar54._14_2_ + 0x80;
      uVar35 = auVar37._0_2_ * uVar31 + sVar52;
      uVar38 = auVar37._2_2_ * auVar15._2_2_ + sVar55;
      uVar40 = auVar37._4_2_ * auVar19._0_2_ + sVar56;
      uVar42 = auVar37._6_2_ * sVar32 + sVar60;
      uVar44 = auVar37._8_2_ * auVar12._8_2_ + sVar63;
      uVar46 = auVar37._10_2_ * auVar8._10_2_ + sVar66;
      uVar48 = auVar37._12_2_ * auVar4._12_2_ + sVar69;
      uVar50 = auVar37._14_2_ * uVar14 + sVar72;
      uVar36 = uVar35 >> 8;
      uVar39 = uVar38 >> 8;
      uVar41 = uVar40 >> 8;
      uVar43 = uVar42 >> 8;
      uVar45 = uVar44 >> 8;
      uVar47 = uVar46 >> 8;
      uVar49 = uVar48 >> 8;
      uVar51 = uVar50 >> 8;
      uVar57 = sVar52 + auVar37._0_2_ * (ushort)auVar1[8];
      uVar61 = sVar55 + auVar37._2_2_ * (ushort)auVar1[9];
      uVar64 = sVar56 + auVar37._4_2_ * (ushort)auVar1[10];
      uVar67 = sVar60 + auVar37._6_2_ * (ushort)auVar1[0xb];
      uVar70 = sVar63 + auVar37._8_2_ * (ushort)auVar1[0xc];
      uVar73 = sVar66 + auVar37._10_2_ * (ushort)auVar1[0xd];
      uVar76 = sVar69 + auVar37._12_2_ * (ushort)auVar1[0xe];
      uVar79 = sVar72 + auVar37._14_2_ * (ushort)auVar1[0xf];
      uVar58 = uVar57 >> 8;
      uVar62 = uVar61 >> 8;
      uVar65 = uVar64 >> 8;
      uVar68 = uVar67 >> 8;
      uVar71 = uVar70 >> 8;
      uVar74 = uVar73 >> 8;
      uVar77 = uVar76 >> 8;
      uVar80 = uVar79 >> 8;
      *dst = (uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) - (0xff < uVar36);
      dst[1] = (uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39);
      dst[2] = (uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41);
      dst[3] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43);
      dst[4] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
      dst[5] = (uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47);
      dst[6] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
      dst[7] = (uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8) - (0xff < uVar51);
      dst[8] = (uVar58 != 0) * (uVar58 < 0x100) * (char)(uVar57 >> 8) - (0xff < uVar58);
      dst[9] = (uVar62 != 0) * (uVar62 < 0x100) * (char)(uVar61 >> 8) - (0xff < uVar62);
      dst[10] = (uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65);
      dst[0xb] = (uVar68 != 0) * (uVar68 < 0x100) * (char)(uVar67 >> 8) - (0xff < uVar68);
      dst[0xc] = (uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar71);
      dst[0xd] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
      dst[0xe] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
      dst[0xf] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
      dst = dst + stride;
    } while (uVar28 < 0xd0c0d0d);
    bVar29 = uVar27 < 0x30;
    uVar27 = uVar27 + 0x10;
  } while (bVar29);
  return;
}

Assistant:

void aom_smooth_v_predictor_16x64_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[63]);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i round = _mm_set1_epi16(128);
  const __m128i zero = _mm_setzero_si128();
  const __m128i top = LoadUnaligned16(top_row);
  const __m128i top_lo = cvtepu8_epi16(top);
  const __m128i top_hi = _mm_unpackhi_epi8(top, zero);
  const uint8_t *weights_base_ptr = smooth_weights + 60;
  for (int left_offset = 0; left_offset < 64; left_offset += 16) {
    const __m128i weights = LoadUnaligned16(weights_base_ptr + left_offset);
    const __m128i weights_lo = cvtepu8_epi16(weights);
    const __m128i weights_hi = _mm_unpackhi_epi8(weights, zero);
    const __m128i inverted_weights_lo = _mm_sub_epi16(scale, weights_lo);
    const __m128i inverted_weights_hi = _mm_sub_epi16(scale, weights_hi);
    const __m128i scaled_bottom_left_lo =
        _mm_mullo_epi16(inverted_weights_lo, bottom_left);
    const __m128i scaled_bottom_left_hi =
        _mm_mullo_epi16(inverted_weights_hi, bottom_left);

    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i weights_y = _mm_shuffle_epi8(weights_lo, y_select);
      const __m128i scaled_bottom_left_y =
          _mm_shuffle_epi8(scaled_bottom_left_lo, y_select);
      write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      dst += stride;
    }
    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i weights_y = _mm_shuffle_epi8(weights_hi, y_select);
      const __m128i scaled_bottom_left_y =
          _mm_shuffle_epi8(scaled_bottom_left_hi, y_select);
      write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      dst += stride;
    }
  }
}